

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

Port * __thiscall rtosc::Ports::apropos(Ports *this,char *path)

{
  bool bVar1;
  Port *pPVar2;
  reference pPVar3;
  char *pcVar4;
  Ports *in_RSI;
  char *in_RDI;
  Port *port_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range1_1;
  Port *port;
  const_iterator __end1;
  const_iterator __begin1;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range1;
  char *path_end;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *in_stack_ffffffffffffff88;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  local_50 [2];
  reference local_40;
  Port *local_38;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  local_30 [2];
  char *in_stack_ffffffffffffffe0;
  
  if ((in_RSI != (Ports *)0x0) &&
     (*(char *)&(in_RSI->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                _M_impl.super__Vector_impl_data._M_start == '/')) {
    in_RSI = (Ports *)((long)&(in_RSI->ports).
                              super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                              super__Vector_impl_data._M_start + 1);
  }
  local_30[0]._M_current =
       (Port *)std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::begin
                         (in_stack_ffffffffffffff88);
  local_38 = (Port *)std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::end
                               (in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff90,
                            (__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
               ::operator*(local_30);
    pcVar4 = strchr(local_40->name,0x2f);
    if ((pcVar4 != (char *)0x0) &&
       (pcVar4 = rtosc_match_path(in_RDI,(char *)in_stack_ffffffffffffff90,
                                  (char **)in_stack_ffffffffffffff88), pcVar4 != (char *)0x0)) {
      if (local_40->ports == (Ports *)0x0) {
        return local_40;
      }
      pcVar4 = strchr((char *)in_RSI,0x2f);
      if (pcVar4[1] == '\0') {
        return local_40;
      }
      pPVar2 = apropos(in_RSI,in_stack_ffffffffffffffe0);
      return pPVar2;
    }
    __gnu_cxx::
    __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
    ::operator++(local_30);
  }
  local_50[0]._M_current =
       (Port *)std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::begin
                         (in_stack_ffffffffffffff88);
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::end(in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff90,
                       (__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      return (Port *)0x0;
    }
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
             ::operator*(local_50);
    if (*(char *)&(in_RSI->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                  _M_impl.super__Vector_impl_data._M_start != '\0') {
      pcVar4 = strstr(pPVar3->name,(char *)in_RSI);
      if (pcVar4 == pPVar3->name) {
        return pPVar3;
      }
      pcVar4 = rtosc_match_path(in_RDI,(char *)in_stack_ffffffffffffff90,
                                (char **)in_stack_ffffffffffffff88);
      if (pcVar4 != (char *)0x0) {
        return pPVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
    ::operator++(local_50);
  } while( true );
}

Assistant:

const Port *Ports::apropos(const char *path) const
{
    if(path && path[0] == '/')
        ++path;

    const char* path_end;
    for(const Port &port: ports)
        if(strchr(port.name,'/') && rtosc_match_path(port.name,path, &path_end))
            return (port.ports && strchr(path,'/')[1])
                ? port.ports->apropos(path_end)
                : &port;

    //This is the lowest level, now find the best port
    for(const Port &port: ports)
        if(*path && (strstr(port.name, path)==port.name ||
                    rtosc_match_path(port.name, path, NULL)))
            return &port;

    return NULL;
}